

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::LastIndexOfHelper<Js::JavascriptNativeFloatArray>
              (JavascriptNativeFloatArray *pArr,Var search,int64 fromIndex,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  uint32 index_00;
  Var pvVar6;
  undefined4 *puVar7;
  uint local_50;
  uint32 index_1;
  uint32 i;
  uint32 end;
  Var index;
  Var pvStack_38;
  bool isSearchTaggedInt;
  Var element;
  ScriptContext *scriptContext_local;
  int64 fromIndex_local;
  Var search_local;
  JavascriptNativeFloatArray *pArr_local;
  
  pvStack_38 = (Var)0x0;
  element = scriptContext;
  scriptContext_local = (ScriptContext *)fromIndex;
  fromIndex_local = (int64)search;
  search_local = pArr;
  bVar2 = TaggedInt::Is(search);
  do {
    while( true ) {
      if ((long)scriptContext_local < 0xffffffff) {
        if (0xfffffffe < (long)scriptContext_local) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1347,"(fromIndex < MaxArrayLength)",
                                      "fromIndex < MaxArrayLength");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        uVar5 = (uint)scriptContext_local;
        local_50 = 0;
        do {
          if (uVar5 < local_50) {
            pvVar6 = TaggedInt::ToVarUnchecked(-1);
            return pvVar6;
          }
          index_00 = uVar5 - local_50;
          BVar4 = TryTemplatedGetItem<Js::JavascriptNativeFloatArray,unsigned_int>
                            ((RecyclableObject *)search_local,index_00,&stack0xffffffffffffffc8,
                             (ScriptContext *)element,true);
          if (BVar4 != 0) {
            if ((bVar2) && (bVar3 = TaggedInt::Is(pvStack_38), bVar3)) {
              if (pvStack_38 == (Var)fromIndex_local) {
                pvVar6 = JavascriptNumber::ToVar(index_00,(ScriptContext *)element);
                return pvVar6;
              }
            }
            else {
              BVar4 = Js::JavascriptOperators::StrictEqual
                                (pvStack_38,(Var)fromIndex_local,(ScriptContext *)element);
              if (BVar4 != 0) {
                pvVar6 = JavascriptNumber::ToVar(index_00,(ScriptContext *)element);
                return pvVar6;
              }
            }
          }
          local_50 = local_50 + 1;
        } while( true );
      }
      pvVar6 = JavascriptNumber::ToVar((int64)scriptContext_local,(ScriptContext *)element);
      BVar4 = Js::JavascriptOperators::OP_HasItem(search_local,pvVar6,(ScriptContext *)element);
      if (BVar4 != 0) break;
LAB_010ef6fb:
      scriptContext_local = (ScriptContext *)((long)&scriptContext_local[-1].nextPendingClose + 7);
    }
    pvStack_38 = Js::JavascriptOperators::OP_GetElementI
                           (search_local,pvVar6,(ScriptContext *)element);
    if ((!bVar2) || (bVar3 = TaggedInt::Is(pvStack_38), !bVar3)) {
      BVar4 = Js::JavascriptOperators::StrictEqual
                        (pvStack_38,(Var)fromIndex_local,(ScriptContext *)element);
      if (BVar4 != 0) {
        return pvVar6;
      }
      goto LAB_010ef6fb;
    }
    if (pvStack_38 == (Var)fromIndex_local) {
      return pvVar6;
    }
    scriptContext_local = (ScriptContext *)((long)&scriptContext_local[-1].nextPendingClose + 7);
  } while( true );
}

Assistant:

Var JavascriptArray::LastIndexOfHelper(T* pArr, Var search, int64 fromIndex, ScriptContext * scriptContext)
    {
        Var element = nullptr;
        bool isSearchTaggedInt = TaggedInt::Is(search);

        // First handle the indices > 2^32
        while (fromIndex >= MaxArrayLength)
        {
            Var index = JavascriptNumber::ToVar(fromIndex, scriptContext);

            if (JavascriptOperators::OP_HasItem(pArr, index, scriptContext))
            {
                element = JavascriptOperators::OP_GetElementI(pArr, index, scriptContext);

                if (isSearchTaggedInt && TaggedInt::Is(element))
                {
                    if (element == search)
                    {
                        return index;
                    }
                    fromIndex--;
                    continue;
                }

                if (JavascriptOperators::StrictEqual(element, search, scriptContext))
                {
                    return index;
                }
            }

            fromIndex--;
        }

        Assert(fromIndex < MaxArrayLength);

        // fromIndex now has to be < MaxArrayLength so casting to uint32 is safe
        uint32 end = static_cast<uint32>(fromIndex);

        for (uint32 i = 0; i <= end; i++)
        {
            uint32 index = end - i;

            if (!TryTemplatedGetItem<T>(pArr, index, &element, scriptContext))
            {
                continue;
            }

            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (element == search)
                {
                    return JavascriptNumber::ToVar(index, scriptContext);
                }
                continue;
            }

            if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                return JavascriptNumber::ToVar(index, scriptContext);
            }
        }

        return TaggedInt::ToVarUnchecked(-1);
    }